

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode Curl_socket(connectdata *conn,Curl_addrinfo *ai,Curl_sockaddr_ex *addr,
                    curl_socket_t *sockfd)

{
  curl_socket_t cVar1;
  int iVar2;
  int local_d4;
  sockaddr_in6 *sa6;
  Curl_sockaddr_ex dummy;
  Curl_easy *data;
  curl_socket_t *sockfd_local;
  Curl_sockaddr_ex *addr_local;
  Curl_addrinfo *ai_local;
  connectdata *conn_local;
  
  dummy._sa_ex_u._120_8_ = conn->data;
  sockfd_local = &addr->family;
  if (addr == (Curl_sockaddr_ex *)0x0) {
    sockfd_local = (curl_socket_t *)&sa6;
  }
  *sockfd_local = ai->ai_family;
  sockfd_local[1] = conn->socktype;
  if (conn->socktype == 2) {
    local_d4 = 0x11;
  }
  else {
    local_d4 = ai->ai_protocol;
  }
  sockfd_local[2] = local_d4;
  sockfd_local[3] = ai->ai_addrlen;
  if (0x80 < (uint)sockfd_local[3]) {
    sockfd_local[3] = 0x80;
  }
  memcpy(sockfd_local + 4,ai->ai_addr,(ulong)(uint)sockfd_local[3]);
  if (*(long *)(dummy._sa_ex_u._120_8_ + 0x750) == 0) {
    iVar2 = socket(*sockfd_local,sockfd_local[1],sockfd_local[2]);
    *sockfd = iVar2;
  }
  else {
    Curl_set_in_callback((Curl_easy *)dummy._sa_ex_u._120_8_,true);
    cVar1 = (**(code **)(dummy._sa_ex_u._120_8_ + 0x750))
                      (*(undefined8 *)(dummy._sa_ex_u._120_8_ + 0x758),0,sockfd_local);
    *sockfd = cVar1;
    Curl_set_in_callback((Curl_easy *)dummy._sa_ex_u._120_8_,false);
  }
  if (*sockfd == -1) {
    conn_local._4_4_ = CURLE_COULDNT_CONNECT;
  }
  else {
    if ((conn->scope_id != 0) && (*sockfd_local == 10)) {
      sockfd_local[10] = conn->scope_id;
    }
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_socket(struct connectdata *conn,
                     const Curl_addrinfo *ai,
                     struct Curl_sockaddr_ex *addr,
                     curl_socket_t *sockfd)
{
  struct Curl_easy *data = conn->data;
  struct Curl_sockaddr_ex dummy;

  if(!addr)
    /* if the caller doesn't want info back, use a local temp copy */
    addr = &dummy;

  /*
   * The Curl_sockaddr_ex structure is basically libcurl's external API
   * curl_sockaddr structure with enough space available to directly hold
   * any protocol-specific address structures. The variable declared here
   * will be used to pass / receive data to/from the fopensocket callback
   * if this has been set, before that, it is initialized from parameters.
   */

  addr->family = ai->ai_family;
  addr->socktype = conn->socktype;
  addr->protocol = conn->socktype == SOCK_DGRAM?IPPROTO_UDP:ai->ai_protocol;
  addr->addrlen = ai->ai_addrlen;

  if(addr->addrlen > sizeof(struct Curl_sockaddr_storage))
     addr->addrlen = sizeof(struct Curl_sockaddr_storage);
  memcpy(&addr->sa_addr, ai->ai_addr, addr->addrlen);

  if(data->set.fopensocket) {
   /*
    * If the opensocket callback is set, all the destination address
    * information is passed to the callback. Depending on this information the
    * callback may opt to abort the connection, this is indicated returning
    * CURL_SOCKET_BAD; otherwise it will return a not-connected socket. When
    * the callback returns a valid socket the destination address information
    * might have been changed and this 'new' address will actually be used
    * here to connect.
    */
    Curl_set_in_callback(data, true);
    *sockfd = data->set.fopensocket(data->set.opensocket_client,
                                    CURLSOCKTYPE_IPCXN,
                                    (struct curl_sockaddr *)addr);
    Curl_set_in_callback(data, false);
  }
  else
    /* opensocket callback not set, so simply create the socket now */
    *sockfd = socket(addr->family, addr->socktype, addr->protocol);

  if(*sockfd == CURL_SOCKET_BAD)
    /* no socket, no connection */
    return CURLE_COULDNT_CONNECT;

#if defined(ENABLE_IPV6) && defined(HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID)
  if(conn->scope_id && (addr->family == AF_INET6)) {
    struct sockaddr_in6 * const sa6 = (void *)&addr->sa_addr;
    sa6->sin6_scope_id = conn->scope_id;
  }
#endif

  return CURLE_OK;

}